

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_result ma_context_get_device_info__jack
                    (ma_context *pContext,ma_device_type deviceType,ma_device_id *pDeviceID,
                    ma_share_mode shareMode,ma_device_info *pDeviceInfo)

{
  ma_result mVar1;
  ma_uint32 mVar2;
  ma_jack_client_t *in_RAX;
  ma_log_proc p_Var3;
  long lVar4;
  uint uVar5;
  char *pcVar6;
  ma_jack_client_t *pClient;
  
  if (pContext == (ma_context *)0x0) {
    __assert_fail("pContext != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                  ,0x50d9,
                  "ma_result ma_context_get_device_info__jack(ma_context *, ma_device_type, const ma_device_id *, ma_share_mode, ma_device_info *)"
                 );
  }
  if (shareMode == ma_share_mode_exclusive) {
    mVar1 = -0x66;
  }
  else if ((pDeviceID == (ma_device_id *)0x0) || (pDeviceID->wasapi[0] == L'\0')) {
    pcVar6 = "Default Capture Device";
    if (deviceType == ma_device_type_playback) {
      pcVar6 = "Default Playback Device";
    }
    pClient = in_RAX;
    ma_strncpy_s(pDeviceInfo->name,0x100,pcVar6,0xffffffffffffffff);
    pDeviceInfo->formatCount = 1;
    pDeviceInfo->formats[0] = ma_format_f32;
    mVar1 = ma_context_open_client__jack(pContext,&pClient);
    if (mVar1 == 0) {
      mVar2 = (*(pContext->field_21).alsa.snd_pcm_hw_params_get_format_mask)(pClient);
      pDeviceInfo->minChannels = 0;
      pDeviceInfo->maxChannels = 0;
      pDeviceInfo->minSampleRate = mVar2;
      pDeviceInfo->maxSampleRate = mVar2;
      lVar4 = (*(pContext->field_21).alsa.snd_pcm_hw_params_set_rate_resample)
                        (pClient,0,"32 bit float mono audio",
                         (ulong)(deviceType != ma_device_type_playback) + 5);
      if (lVar4 != 0) {
        uVar5 = pDeviceInfo->minChannels;
        while (*(long *)(lVar4 + (ulong)uVar5 * 8) != 0) {
          uVar5 = uVar5 + 1;
          pDeviceInfo->minChannels = uVar5;
          pDeviceInfo->maxChannels = pDeviceInfo->maxChannels + 1;
        }
        (*(pContext->field_21).alsa.snd_pcm_hw_params_get_channels_min)(lVar4);
        (*(pContext->field_21).alsa.snd_pcm_close)(pClient);
        return 0;
      }
      (*(pContext->field_21).alsa.snd_pcm_close)(pClient);
      p_Var3 = pContext->logCallback;
      mVar1 = -0x12d;
      if (p_Var3 == (ma_log_proc)0x0) {
        return -0x12d;
      }
      pcVar6 = "[JACK] Failed to query physical ports.";
    }
    else {
      p_Var3 = pContext->logCallback;
      if (p_Var3 == (ma_log_proc)0x0) {
        return mVar1;
      }
      pcVar6 = "[JACK] Failed to open client.";
    }
    (*p_Var3)(pContext,(ma_device *)0x0,1,pcVar6);
  }
  else {
    mVar1 = -0x68;
  }
  return mVar1;
}

Assistant:

static ma_result ma_context_get_device_info__jack(ma_context* pContext, ma_device_type deviceType, const ma_device_id* pDeviceID, ma_share_mode shareMode, ma_device_info* pDeviceInfo)
{
    ma_jack_client_t* pClient;
    ma_result result;
    const char** ppPorts;

    MA_ASSERT(pContext != NULL);

    /* No exclusive mode with the JACK backend. */
    if (shareMode == ma_share_mode_exclusive) {
        return MA_SHARE_MODE_NOT_SUPPORTED;
    }

    if (pDeviceID != NULL && pDeviceID->jack != 0) {
        return MA_NO_DEVICE;   /* Don't know the device. */
    }

    /* Name / Description */
    if (deviceType == ma_device_type_playback) {
        ma_strncpy_s(pDeviceInfo->name, sizeof(pDeviceInfo->name), MA_DEFAULT_PLAYBACK_DEVICE_NAME, (size_t)-1);
    } else {
        ma_strncpy_s(pDeviceInfo->name, sizeof(pDeviceInfo->name), MA_DEFAULT_CAPTURE_DEVICE_NAME, (size_t)-1);
    }

    /* Jack only supports f32 and has a specific channel count and sample rate. */
    pDeviceInfo->formatCount = 1;
    pDeviceInfo->formats[0] = ma_format_f32;

    /* The channel count and sample rate can only be determined by opening the device. */
    result = ma_context_open_client__jack(pContext, &pClient);
    if (result != MA_SUCCESS) {
        return ma_context_post_error(pContext, NULL, MA_LOG_LEVEL_ERROR, "[JACK] Failed to open client.", result);
    }

    pDeviceInfo->minSampleRate = ((ma_jack_get_sample_rate_proc)pContext->jack.jack_get_sample_rate)((ma_jack_client_t*)pClient);
    pDeviceInfo->maxSampleRate = pDeviceInfo->minSampleRate;

    pDeviceInfo->minChannels = 0;
    pDeviceInfo->maxChannels = 0;

    ppPorts = ((ma_jack_get_ports_proc)pContext->jack.jack_get_ports)((ma_jack_client_t*)pClient, NULL, MA_JACK_DEFAULT_AUDIO_TYPE, ma_JackPortIsPhysical | ((deviceType == ma_device_type_playback) ? ma_JackPortIsInput : ma_JackPortIsOutput));
    if (ppPorts == NULL) {
        ((ma_jack_client_close_proc)pContext->jack.jack_client_close)((ma_jack_client_t*)pClient);
        return ma_context_post_error(pContext, NULL, MA_LOG_LEVEL_ERROR, "[JACK] Failed to query physical ports.", MA_FAILED_TO_OPEN_BACKEND_DEVICE);
    }

    while (ppPorts[pDeviceInfo->minChannels] != NULL) {
        pDeviceInfo->minChannels += 1;
        pDeviceInfo->maxChannels += 1;
    }

    ((ma_jack_free_proc)pContext->jack.jack_free)((void*)ppPorts);
    ((ma_jack_client_close_proc)pContext->jack.jack_client_close)((ma_jack_client_t*)pClient);

    (void)pContext;
    return MA_SUCCESS;
}